

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void * luaL_testudata(lua_State *L,int idx,char *tname)

{
  ulong uVar1;
  TValue *pTVar2;
  size_t lenx;
  GCstr *key;
  cTValue *pcVar3;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar4;
  bool bVar5;
  
  pTVar2 = index2adr(L,idx);
  aVar4 = pTVar2->field_4;
  if (aVar4.it >> 0xf == 0x1fff3) {
    uVar1 = *(ulong *)((L->glref).ptr64 + 0x110);
    lenx = strlen(tname);
    key = lj_str_new(L,tname,lenx);
    pcVar3 = lj_tab_getstr((GCtab *)(uVar1 & 0x7fffffffffff),key);
    bVar5 = true;
    if ((pcVar3 != (cTValue *)0x0) && ((pcVar3->u64 & 0xffff800000000000) == 0xfffa000000000000)) {
      bVar5 = (pcVar3->u64 & 0x7fffffffffff) != *(ulong *)(((ulong)aVar4 & 0x7fffffffffff) + 0x20);
      aVar4 = (anon_struct_8_2_7fa0a05d_for_TValue_4)(((ulong)aVar4 & 0x7fffffffffff) + 0x30);
    }
    if (!bVar5) {
      return (void *)aVar4;
    }
  }
  return (void *)0x0;
}

Assistant:

LUALIB_API void *luaL_testudata(lua_State *L, int idx, const char *tname)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    cTValue *tv = lj_tab_getstr(tabV(registry(L)), lj_str_newz(L, tname));
    if (tv && tvistab(tv) && tabV(tv) == tabref(ud->metatable))
      return uddata(ud);
  }
  return NULL;  /* value is not a userdata with a metatable */
}